

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.c
# Opt level: O2

CgreenVector * create_vector_of_double_markers_for(char *parameters)

{
  _Bool value;
  CgreenVector *vector;
  char *__s;
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  _Bool *item;
  
  vector = create_cgreen_vector(free);
  if ((parameters != (char *)0x0) && (*parameters != '\0')) {
    __s = stringdup(parameters);
    if (__s != (char *)0x0) {
      sVar1 = strlen(__s);
      tokenise_by_commas_and_whitespace(__s);
      pcVar3 = __s;
      while( true ) {
        sVar2 = strlen(parameters);
        if (__s + sVar2 <= pcVar3) break;
        pcVar3 = skip_nulls_until(pcVar3,__s + sVar1);
        sVar2 = strlen(pcVar3);
        value = begins_with(pcVar3,"box_double");
        item = pointer_to_bool(value);
        cgreen_vector_add(vector,item);
        strip_function_from(pcVar3,"box_double");
        strip_function_from(pcVar3,"d");
        pcVar3 = pcVar3 + (int)sVar2;
      }
      free(__s);
    }
  }
  return vector;
}

Assistant:

CgreenVector *create_vector_of_double_markers_for(const char *parameters) {
    char *parameters_to_tokenize;
    char *parameters_end;
    char *tokens;
    char *token;
    CgreenVector *markers = create_cgreen_vector(&free);
    if ((parameters == NULL) || (strlen(parameters) == 0)) {
        return markers;
    }

    parameters_to_tokenize = stringdup(parameters);
    if (parameters_to_tokenize == NULL) {
        return markers;
    }

    parameters_end = parameters_to_tokenize + strlen(parameters_to_tokenize);
    tokens = tokenise_by_commas_and_whitespace(parameters_to_tokenize);
    token = tokens;
    while (token < tokens + strlen(parameters)) {
        token = skip_nulls_until(token, parameters_end);
        int length_of_token = strlen(token);
        if (begins_with(token, "box_double"))
            cgreen_vector_add(markers, pointer_to_bool(true));
        else
            cgreen_vector_add(markers, pointer_to_bool(false));
        token = strip_function_from(token, "box_double");
        token = strip_function_from(token, "d");
        token += length_of_token;
    }

    free(tokens);
    return markers;
}